

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawInventoryBar::Tick
          (CommandDrawInventoryBar *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  CommandDrawNumber **ppCVar4;
  CommandDrawNumber *pCVar5;
  int iVar6;
  ulong uVar7;
  ulong local_38;
  
  local_38 = (ulong)hudChanged << 0x20;
  if (this->counters == (CommandDrawNumber **)0x0) {
    iVar2 = GetCounterSpacing(this,statusBar);
    local_38 = (ulong)CONCAT14(hudChanged,iVar2);
    uVar1 = this->size;
    ppCVar4 = (CommandDrawNumber **)operator_new__((ulong)uVar1 * 8);
    this->counters = ppCVar4;
    if ((ulong)uVar1 != 0) {
      local_38 = (ulong)CONCAT14(hudChanged,iVar2 * 2);
      iVar6 = 0;
      uVar7 = 0;
      do {
        pCVar5 = (CommandDrawNumber *)operator_new(0xa0);
        CommandDrawNumber::CommandDrawNumber(pCVar5,(this->super_SBarInfoCommand).script);
        this->counters[uVar7] = pCVar5;
        iVar3 = iVar6;
        if (this->vertical != false) {
          iVar3 = 0;
        }
        (this->counters[uVar7]->super_CommandDrawString).startX =
             (SBarInfoCoordinate)(iVar3 + (int)this->counterX);
        iVar3 = 0;
        if (this->vertical != false) {
          iVar3 = iVar6;
        }
        (this->counters[uVar7]->super_CommandDrawString).y =
             (SBarInfoCoordinate)(iVar3 + (int)this->counterY);
        ppCVar4 = this->counters;
        pCVar5 = ppCVar4[uVar7];
        pCVar5->normalTranslation = this->translation;
        (pCVar5->super_CommandDrawString).font = this->font;
        pCVar5 = ppCVar4[uVar7];
        (pCVar5->super_CommandDrawString).spacing = this->fontSpacing;
        (pCVar5->super_CommandDrawString).field_0x5d = this->alwaysShowCounter ^ 1;
        pCVar5->value = CONSTANT;
        pCVar5->drawValue = 0x1c;
        pCVar5->length = 0x7fffffff;
        (pCVar5->super_CommandDrawString).shadow = this->shadow;
        (pCVar5->super_CommandDrawString).shadowX = this->shadowX;
        (pCVar5->super_CommandDrawString).shadowY = this->shadowY;
        uVar7 = uVar7 + 1;
        iVar6 = iVar6 + iVar2 * 2;
      } while (uVar7 < this->size);
    }
  }
  if (this->size != 0) {
    uVar7 = 0;
    do {
      (*(this->counters[uVar7]->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand
        [5])(this->counters[uVar7],block,statusBar,local_38 >> 0x20);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->size);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			// Make the counters if need be.
			if(counters == NULL)
			{
				int spacing = GetCounterSpacing(statusBar);

				counters = new CommandDrawNumber*[size];
		
				for(unsigned int i = 0;i < size;i++)
				{
					counters[i] = new CommandDrawNumber(script);
		
					counters[i]->startX = counterX + (!vertical ? spacing*i : 0);
					counters[i]->y = counterY + (vertical ? spacing*i : 0);
					counters[i]->normalTranslation = translation;
					counters[i]->font = font;
					counters[i]->spacing = fontSpacing;
					counters[i]->whenNotZero = !alwaysShowCounter;
					counters[i]->drawValue = counters[i]->value = CommandDrawNumber::CONSTANT;
					counters[i]->length = INT_MAX;
					counters[i]->shadow = shadow;
					counters[i]->shadowX = shadowX;
					counters[i]->shadowY = shadowY;
				}
			}
		
			for(unsigned int i = 0;i < size;i++)
				counters[i]->Tick(block, statusBar, hudChanged);
		}